

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<chrono::ChQuaternion<double>>
          (ChArchiveOut *this,
          ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
          *bVal)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  ChValueSpecific<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
  specVal;
  char buffer [20];
  ChNameValue<chrono::ChQuaternion<double>_> local_98;
  ChValueSpecific<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
  local_80;
  char local_48 [24];
  
  ChValueSpecific<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
  ::ChValueSpecific(&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&local_80,
             (long)(bVal->_value->
                   super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(bVal->_value->
                   super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(bVal->_value->
                            super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(bVal->_value->
                            super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    sprintf(local_48,"%lu",uVar2);
    local_98._value =
         (ChQuaternion<double> *)
         ((long)((bVal->_value->
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar1);
    local_98._flags = '\0';
    local_98._name = local_48;
    out<chrono::ChQuaternion<double>>(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])
              (this,&local_80,
               (long)(bVal->_value->
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(bVal->_value->
                     super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5);
    lVar1 = lVar1 + 0x20;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_80);
  ChValue::~ChValue(&local_80.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue< std::vector<T> > bVal) {
          ChValueSpecific< std::vector<T> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, bVal.value().size());
          for (size_t i = 0; i<bVal.value().size(); ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, bVal.value().size());
          }
          this->out_array_end(specVal, bVal.value().size());
      }